

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_x86_64.cpp
# Opt level: O3

void __thiscall hdc::Generator_x86_64::emit(Generator_x86_64 *this,TAC *tac)

{
  undefined1 *puVar1;
  pointer pbVar2;
  ostream *poVar3;
  size_type sVar4;
  char *pcVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  switch(tac->kind) {
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10,".",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->field_0x10,(tac->label)._M_dataplus._M_p,
                        (tac->label)._M_string_length);
    pcVar5 = ":";
    sVar4 = 1;
    goto LAB_0016090d;
  default:
    poVar3 = (ostream *)&this->field_0x10;
    pcVar5 = "x86_64 gen ERROR: undefined tac";
    sVar4 = 0x1f;
    goto LAB_0016090d;
  case 3:
    this->regCounter = -1;
    goto LAB_00160912;
  case 9:
    puVar1 = &this->field_0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"    movl ",9);
    pbVar2 = (this->regs_s).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,pbVar2[this->regCounter]._M_dataplus._M_p,
                        pbVar2[this->regCounter]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", %ecx\n",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"    sall %cl, ",0xe);
    pbVar2 = (this->regs_s).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,pbVar2[(long)this->regCounter + -1]._M_dataplus._M_p,
               pbVar2[(long)this->regCounter + -1]._M_string_length);
    goto LAB_0016088c;
  case 10:
    paVar7 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"andl","");
    emitInstruction(this,&local_38);
    _Var6._M_p = local_38._M_dataplus._M_p;
    break;
  case 0xb:
    paVar7 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"xorl","");
    emitInstruction(this,&local_58);
    _Var6._M_p = local_58._M_dataplus._M_p;
    break;
  case 0xc:
    paVar7 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"orl","");
    emitInstruction(this,&local_78);
    _Var6._M_p = local_78._M_dataplus._M_p;
    break;
  case 0xd:
    paVar7 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"addl","");
    emitInstruction(this,&local_98);
    _Var6._M_p = local_98._M_dataplus._M_p;
    break;
  case 0xe:
    paVar7 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"subl","");
    emitInstruction(this,&local_b8);
    _Var6._M_p = local_b8._M_dataplus._M_p;
    break;
  case 0xf:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->field_0x10,"    cmpl $0, ",0xd);
    pbVar2 = (this->regs_s).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->field_0x10,pbVar2[this->regCounter]._M_dataplus._M_p,
               pbVar2[this->regCounter]._M_string_length);
    pcVar5 = "\n    je .";
    goto LAB_001608e3;
  case 0x10:
    pcVar5 = "    jmp .";
LAB_001608e3:
    poVar3 = (ostream *)&this->field_0x10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,9);
    pcVar5 = (tac->label)._M_dataplus._M_p;
    sVar4 = (tac->label)._M_string_length;
    goto LAB_0016090d;
  case 0x11:
    this->regCounter = this->regCounter + 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10,"    mov $",9);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->field_0x10,(tac->label)._M_dataplus._M_p,
                        (tac->label)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    pbVar2 = (this->regs_s).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar5 = pbVar2[this->regCounter]._M_dataplus._M_p;
    sVar4 = pbVar2[this->regCounter]._M_string_length;
LAB_0016090d:
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,sVar4);
    goto LAB_00160912;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != paVar7) {
    operator_delete(_Var6._M_p);
  }
LAB_0016088c:
  this->regCounter = this->regCounter + -1;
LAB_00160912:
  local_b9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10,&local_b9,1);
  return;
}

Assistant:

void hdc::Generator_x86_64::emit(TAC& tac) {
    switch (tac.kind) {
    case TAC_LABEL:
        output << "." << tac.label << ":";
        break;

    case TAC_END_EXPR:
        regCounter = -1;
        break;

    case TAC_SLL:
        output << "    movl " << regs_s[regCounter] <<", %ecx\n";
        output << "    sall %cl, " << regs_s[regCounter - 1];
        --regCounter;
        break;

    case TAC_BITWISE_AND:
        emitInstruction("andl");
        --regCounter;
        break;

    case TAC_BITWISE_XOR:
        emitInstruction("xorl");
        --regCounter;
        break;

    case TAC_BITWISE_OR:
        emitInstruction("orl");
        --regCounter;
        break;

    case TAC_ADD:
        emitInstruction("addl");
        --regCounter;
        break;

    case TAC_SUB:
        emitInstruction("subl");
        --regCounter;
        break;

    case TAC_IFZ:
        output << "    cmpl $0, " << regs_s[regCounter];
        output << "\n    je ." << tac.label;
        break;

    case TAC_GOTO:
        output << "    jmp ." << tac.label;
        break;

    case TAC_CONST_I32:
        ++regCounter;
        output << "    mov $" << tac.label << ", " << regs_s[regCounter];
        break;

    default:
        output << "x86_64 gen ERROR: undefined tac";
        break;
    }

    output << '\n';
}